

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall
Rml::Context::GenerateMouseEventParameters(Context *this,Dictionary *parameters,int button_index)

{
  type pVVar1;
  int local_1c;
  flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
  *pfStack_18;
  int button_index_local;
  Dictionary *parameters_local;
  Context *this_local;
  
  local_1c = button_index;
  pfStack_18 = (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                *)parameters;
  parameters_local = (Dictionary *)this;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::reserve(parameters,3);
  pVVar1 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[8]>(pfStack_18,(char (*) [8])"mouse_x");
  Variant::operator=(pVVar1,&(this->mouse_position).x);
  pVVar1 = itlib::
           flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           ::operator[]<char_const(&)[8]>(pfStack_18,(char (*) [8])"mouse_y");
  Variant::operator=(pVVar1,&(this->mouse_position).y);
  if (-1 < local_1c) {
    pVVar1 = itlib::
             flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
             ::operator[]<char_const(&)[7]>(pfStack_18,(char (*) [7])"button");
    Variant::operator=(pVVar1,&local_1c);
  }
  return;
}

Assistant:

void Context::GenerateMouseEventParameters(Dictionary& parameters, int button_index)
{
	parameters.reserve(3);
	parameters["mouse_x"] = mouse_position.x;
	parameters["mouse_y"] = mouse_position.y;
	if (button_index >= 0)
		parameters["button"] = button_index;
}